

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_readwrite(connectdata *conn,Curl_easy *data,_Bool *done,_Bool *comeback)

{
  long lVar1;
  int *piVar2;
  long *plVar3;
  char **ppcVar4;
  char cVar5;
  int iVar6;
  _func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *p_Var7;
  Curl_handler *pCVar8;
  void *pvVar9;
  curl_off_t *pcVar10;
  curl_off_t cVar11;
  _Bool _Var12;
  uint uVar13;
  CURLcode CVar14;
  CHUNKcode code;
  anon_enum_32 aVar15;
  int iVar16;
  time_t tVar17;
  char *pcVar18;
  long lVar19;
  long lVar20;
  size_t sVar21;
  size_t len;
  long lVar22;
  curl_socket_t writefd;
  size_t sVar23;
  uint uVar24;
  uint uVar25;
  curl_socket_t readfd0;
  uint uVar26;
  bool bVar27;
  timeval tVar28;
  ssize_t bytes_written;
  _Bool local_55;
  _Bool readmore;
  _Bool *local_50;
  SingleRequest *local_48;
  long local_40;
  _Bool *local_38;
  
  uVar24 = conn->cselect_bits;
  conn->cselect_bits = 0;
  uVar13 = (data->req).keepon;
  writefd = -1;
  readfd0 = -1;
  if ((uVar13 & 0x15) == 1) {
    readfd0 = conn->sockfd;
  }
  if ((uVar13 & 0x2a) == 2) {
    writefd = conn->writesockfd;
  }
  uVar24 = uVar24 | (conn->data->state).drain != 0;
  if (uVar24 == 0) {
    uVar24 = Curl_socket_check(readfd0,-1,writefd,0);
  }
  if (uVar24 == 4) {
    Curl_failf(data,"select/poll returned error");
    return CURLE_SEND_ERROR;
  }
  local_48 = &data->req;
  uVar13 = (data->req).keepon;
  uVar26 = 0;
  local_38 = comeback;
  if (((uVar13 & 1) != 0) &&
     (((uVar24 & 1) != 0 || (uVar26 = 0, (conn->bits).stream_was_rewound == true)))) {
    _readmore = _readmore & 0xffffff00;
    *done = false;
    *comeback = false;
    iVar16 = 100;
    uVar26 = 0;
    local_40 = 0;
    local_50 = done;
    do {
      sVar21 = (data->set).buffer_size;
      if (sVar21 == 0) {
        sVar21 = 0x4000;
      }
      lVar20 = (data->req).size;
      if ((lVar20 == -1) || ((data->req).header != false)) {
LAB_0012627e:
        CVar14 = Curl_read(conn,conn->sockfd,(data->req).buf,sVar21,&bytes_written);
        if (CVar14 == CURLE_OK) {
          lVar22 = (data->req).bytecount;
          goto LAB_001262a8;
        }
        if (CVar14 != CURLE_AGAIN) {
          return CVar14;
        }
LAB_00126ad4:
        if (0 < iVar16) goto LAB_00126aec;
        break;
      }
      lVar22 = (data->req).bytecount;
      sVar23 = lVar20 - lVar22;
      if ((long)sVar23 < (long)sVar21) {
        sVar21 = sVar23;
      }
      if (sVar21 != 0) goto LAB_0012627e;
      bytes_written = 0;
LAB_001262a8:
      if (((lVar22 == 0) && ((data->req).writebytecount == 0)) &&
         (Curl_pgrsTime(data,TIMER_STARTTRANSFER), (data->req).exp100 != EXP100_SEND_DATA)) {
        tVar28 = curlx_tvnow();
        (data->req).start100 = tVar28;
      }
      if (bytes_written == 0) {
        bVar27 = (data->req).bodywrites == 0;
      }
      else {
        bVar27 = false;
      }
      if (bytes_written < 1 && !bVar27) {
        piVar2 = &(data->req).keepon;
        *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
LAB_00126ace:
        uVar26 = 1;
        goto LAB_00126ad4;
      }
      (data->req).buf[bytes_written] = '\0';
      (data->req).str = (data->req).buf;
      p_Var7 = conn->handler->readwrite;
      if (p_Var7 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0) {
        CVar14 = (*p_Var7)(data,conn,&bytes_written,&readmore);
        if (CVar14 != CURLE_OK) {
          return CVar14;
        }
        if (readmore != false) goto LAB_00126ace;
      }
      if ((data->req).header == true) {
        local_55 = false;
        CVar14 = Curl_http_readwrite_headers(data,conn,&bytes_written,&local_55);
        if (CVar14 != CURLE_OK) {
          return CVar14;
        }
        p_Var7 = conn->handler->readwrite;
        if (((p_Var7 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0)
            && ((data->req).maxdownload < 1)) && (0 < bytes_written)) {
          CVar14 = (*p_Var7)(data,conn,&bytes_written,&readmore);
          if (CVar14 != CURLE_OK) {
            return CVar14;
          }
          if (readmore != false) goto LAB_00126ace;
        }
        if (local_55 == true) {
          if (0 < bytes_written) {
            _Var12 = Curl_pipeline_wanted(conn->data->multi,1);
            pcVar18 = (data->state).path;
            if (_Var12) {
              Curl_infof(data,"Rewinding stream by : %zd bytes on url %s (zero-length body)\n",
                         bytes_written,pcVar18);
              conn->read_pos = conn->read_pos - bytes_written;
              (conn->bits).stream_was_rewound = true;
            }
            else {
              Curl_infof(data,
                         "Excess found in a non pipelined read: excess = %zd url = %s (zero-length body)\n"
                         ,bytes_written,pcVar18);
            }
          }
          goto LAB_00126ace;
        }
      }
      if ((((data->req).str != (char *)0x0) && ((data->req).header == false)) &&
         (0 < bytes_written || bVar27)) {
        if ((data->set).opt_no_body == true) {
          Curl_conncontrol(conn,2);
          *local_50 = true;
          return CURLE_WEIRD_SERVER_REPLY;
        }
        if (((data->req).bodywrites == 0 && !bVar27) && ((conn->handler->protocol & 0x40003) != 0))
        {
          if ((data->req).newurl != (char *)0x0) {
            if ((conn->bits).close == true) {
              piVar2 = &(data->req).keepon;
              *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
              *local_50 = true;
              uVar26 = 1;
              done = local_50;
              goto LAB_00126b28;
            }
            (data->req).ignorebody = true;
            Curl_infof(data,"Ignoring the response-body\n");
          }
          lVar20 = (data->state).resume_from;
          if ((((lVar20 != 0) && ((data->req).content_range == false)) &&
              ((data->set).httpreq == HTTPREQ_GET)) && ((data->req).ignorebody == false)) {
            if (local_48->size != lVar20) {
              Curl_failf(data,"HTTP server doesn\'t seem to support byte ranges. Cannot resume.");
              return CURLE_RANGE_ERROR;
            }
            Curl_infof(data,"The entire document is already downloaded");
            uVar26 = 1;
            Curl_conncontrol(conn,1);
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
            *local_50 = true;
            done = local_50;
            goto LAB_00126b28;
          }
          if ((((data->set).timecondition != CURL_TIMECOND_NONE) &&
              ((data->state).range == (char *)0x0)) &&
             (_Var12 = Curl_meets_timecondition(data,(data->req).timeofdoc), done = local_50,
             !_Var12)) {
            *local_50 = true;
            (data->info).httpcode = 0x130;
            Curl_infof(data,"Simulate a HTTP 304 response!\n");
            uVar26 = 1;
            Curl_conncontrol(conn,1);
            goto LAB_00126b28;
          }
        }
        plVar3 = &(data->req).bodywrites;
        *plVar3 = *plVar3 + 1;
        if (((data->set).verbose == true) &&
           (((data->req).badheader == HEADER_NORMAL ||
            (Curl_debug(data,CURLINFO_DATA_IN,(data->state).headerbuff,(data->req).hbuflen,conn),
            (data->req).badheader == HEADER_PARTHEADER)))) {
          Curl_debug(data,CURLINFO_DATA_IN,(data->req).str,bytes_written,conn);
        }
        if ((data->req).chunk == true) {
          code = Curl_httpchunk_read(conn,(data->req).str,bytes_written,&bytes_written);
          if (CHUNKE_OK < code) {
            if (code != CHUNKE_WRITE_ERROR) {
              pcVar18 = Curl_chunked_strerror(code);
              Curl_failf(data,"%s in chunked-encoding",pcVar18);
              return CURLE_RECV_ERROR;
            }
            Curl_failf(data,"Failed writing data");
            return CURLE_WRITE_ERROR;
          }
          if (code == CHUNKE_STOP) {
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
            sVar21 = (conn->chunk).dataleft;
            if (sVar21 != 0) {
              Curl_infof(conn->data,"Leftovers after chunking: %zu bytes\n",sVar21);
              _Var12 = Curl_pipeline_wanted(conn->data->multi,1);
              if (_Var12) {
                Curl_infof(conn->data,"Rewinding %zu bytes\n",sVar21);
                conn->read_pos = conn->read_pos - sVar21;
                (conn->bits).stream_was_rewound = true;
              }
            }
          }
        }
        if ((data->req).badheader == HEADER_NORMAL) {
          lVar20 = (data->req).bytecount;
        }
        else {
          lVar20 = (data->req).bytecount;
          if ((data->req).ignorebody == false) {
            lVar20 = lVar20 + (data->req).hbuflen;
            (data->req).bytecount = lVar20;
          }
        }
        lVar22 = (data->req).maxdownload;
        if (lVar22 != -1) {
          lVar19 = (bytes_written + lVar20) - lVar22;
          if (lVar22 <= bytes_written + lVar20) {
            if ((lVar19 != 0) && ((data->req).ignorebody == false)) {
              _Var12 = Curl_pipeline_wanted(conn->data->multi,1);
              if (_Var12) {
                Curl_infof(data,
                           "Rewinding stream by : %zu bytes on url %s (size = %lld, maxdownload = %lld, bytecount = %lld, nread = %zd)\n"
                           ,lVar19,(data->state).path,(data->req).size,(data->req).maxdownload,
                           (data->req).bytecount,bytes_written);
                conn->read_pos = conn->read_pos - lVar19;
                (conn->bits).stream_was_rewound = true;
              }
              else {
                Curl_infof(data,
                           "Excess found in a non pipelined read: excess = %zu, size = %lld, maxdownload = %lld, bytecount = %lld\n"
                           ,lVar19,(data->req).size,(data->req).maxdownload,(data->req).bytecount);
              }
            }
            lVar20 = (data->req).bytecount;
            bytes_written = (data->req).maxdownload - lVar20;
            if (bytes_written < 1) {
              bytes_written = 0;
            }
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
            local_40 = lVar19;
          }
        }
        (data->req).bytecount = lVar20 + bytes_written;
        Curl_pgrsSetDownloadCounter(data,lVar20 + bytes_written);
        if (((data->req).chunk == false) &&
           (aVar15 = (data->req).badheader,
           (aVar15 != HEADER_NORMAL || bytes_written != 0) || bVar27)) {
          if (aVar15 != HEADER_NORMAL) {
            if ((data->req).ignorebody == false) {
              sVar21 = (data->req).maxdownload;
              sVar23 = (data->req).hbuflen;
              len = sVar21;
              if ((long)sVar23 < (long)sVar21) {
                len = sVar23;
              }
              if (sVar21 == 0xffffffffffffffff) {
                len = sVar23;
              }
              CVar14 = Curl_client_write(conn,1,(data->state).headerbuff,len);
              if (CVar14 != CURLE_OK) {
                return CVar14;
              }
              aVar15 = (data->req).badheader;
            }
            if (aVar15 < HEADER_ALLBAD) goto LAB_00126779;
            goto LAB_001267a6;
          }
LAB_00126779:
          if ((conn->data->set).http_ce_skip == false) {
            iVar6 = (data->req).auto_decoding;
            if (iVar6 == 2) {
              if ((data->req).ignorebody == false) {
                CVar14 = Curl_unencode_gzip_write(conn,local_48,bytes_written);
                goto LAB_0012681f;
              }
            }
            else {
              if (iVar6 != 1) {
                if (iVar6 != 0) {
                  Curl_failf(data,
                             "Unrecognized content encoding type. libcurl understands `identity\', `deflate\' and `gzip\' content encodings."
                            );
                  (data->req).badheader = HEADER_NORMAL;
                  return CURLE_BAD_CONTENT_ENCODING;
                }
                goto LAB_0012679d;
              }
              if ((data->req).ignorebody == false) {
                CVar14 = Curl_unencode_deflate_write(conn,local_48,bytes_written);
                goto LAB_0012681f;
              }
            }
          }
          else {
LAB_0012679d:
            if ((data->req).ignorebody == false) {
              pcVar18 = (data->req).str;
              if ((conn->handler->protocol & 0xc000) == 0) {
                CVar14 = Curl_client_write(conn,1,pcVar18,bytes_written);
              }
              else {
                CVar14 = Curl_pop3_write(conn,pcVar18,bytes_written);
              }
LAB_0012681f:
              (data->req).badheader = HEADER_NORMAL;
              if (CVar14 != CURLE_OK) {
                return CVar14;
              }
              goto LAB_00126831;
            }
          }
LAB_001267a6:
          (data->req).badheader = HEADER_NORMAL;
        }
      }
LAB_00126831:
      pCVar8 = conn->handler;
      p_Var7 = pCVar8->readwrite;
      if (((p_Var7 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0) &&
          (local_40 != 0)) && ((conn->bits).stream_was_rewound == false)) {
        ppcVar4 = &(data->req).str;
        *ppcVar4 = *ppcVar4 + bytes_written;
        bytes_written = local_40;
        CVar14 = (*p_Var7)(data,conn,&bytes_written,&readmore);
        if (CVar14 != CURLE_OK) {
          return CVar14;
        }
        uVar26 = 1;
        if (readmore == true) {
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 | 1;
        }
        goto LAB_00126ad4;
      }
      if (bVar27) {
        piVar2 = &(data->req).keepon;
        *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
      }
      if (((pCVar8->protocol & 0x30) == 0) && (_Var12 = Curl_ssl_data_pending(conn,0), !_Var12))
      goto LAB_00126ace;
      uVar26 = 1;
      bVar27 = iVar16 != 0;
      iVar16 = iVar16 + -1;
    } while (bVar27);
    conn->cselect_bits = 1;
    *local_38 = true;
LAB_00126aec:
    done = local_50;
    if ((((data->req).keepon & 3U) == 2) && ((conn->bits).close == true)) {
      Curl_infof(data,"we are done reading and this is set to close, stop send\n");
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
    }
LAB_00126b28:
    if (*done != false) {
      return CURLE_OK;
    }
    uVar13 = (data->req).keepon;
  }
  uVar25 = uVar26;
  if ((uVar24 & uVar13 & 2) == 0) goto LAB_00126982;
  if (((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) {
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
  }
  uVar25 = uVar26 | 2;
  if ((data->req).upload_present != 0) {
LAB_00126114:
    CVar14 = Curl_write(conn,conn->writesockfd,(data->req).upload_fromhere,
                        (data->req).upload_present,&bytes_written);
    if (CVar14 != CURLE_OK) {
      return CVar14;
    }
    if ((data->set).verbose == true) {
      Curl_debug(data,CURLINFO_DATA_OUT,(data->req).upload_fromhere,bytes_written,conn);
    }
    lVar20 = (data->req).writebytecount + bytes_written;
    (data->req).writebytecount = lVar20;
    if (lVar20 == (data->state).infilesize) {
      (data->req).upload_done = true;
      Curl_infof(data,"We are completely uploaded and fine\n");
    }
    lVar20 = (data->req).upload_present - bytes_written;
    if (lVar20 == 0) {
      (data->req).upload_fromhere = (data->req).uploadbuf;
      (data->req).upload_present = 0;
      if ((((data->req).upload_done == true) &&
          (piVar2 = &(data->req).keepon, *(byte *)piVar2 = (byte)*piVar2 & 0xfd,
          (conn->bits).rewindaftersend == true)) &&
         (CVar14 = Curl_readrewind(conn), CVar14 != CURLE_OK)) {
        return CVar14;
      }
    }
    else {
      (data->req).upload_present = lVar20;
      ppcVar4 = &(data->req).upload_fromhere;
      *ppcVar4 = *ppcVar4 + bytes_written;
    }
    Curl_pgrsSetUploadCounter(data,(data->req).writebytecount);
    goto LAB_00126982;
  }
  (data->req).upload_fromhere = (data->req).uploadbuf;
  if ((data->req).upload_done == false) {
    pvVar9 = (data->req).protop;
    if (((data->req).exp100 == EXP100_SENDING_REQUEST) && (*(int *)((long)pvVar9 + 0x78) == 2)) {
      (data->req).exp100 = EXP100_AWAITING_CONTINUE;
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
      tVar28 = curlx_tvnow();
      (data->req).start100 = tVar28;
      Curl_expire(data,(data->set).expect_100_timeout);
      uVar25 = uVar26;
      goto LAB_00126982;
    }
    if ((conn->handler->protocol & 0x40003) == 0) {
      bVar27 = false;
    }
    else {
      bVar27 = *(int *)((long)pvVar9 + 0x78) == 1;
    }
    CVar14 = Curl_fillreadbuffer(conn,0x4000,(int *)&readmore);
    if (CVar14 != CURLE_OK) {
      return CVar14;
    }
    lVar20 = (long)(int)_readmore;
    if (lVar20 == 0) goto LAB_001268a7;
    if (0 < (int)_readmore) {
      (data->req).upload_present = lVar20;
      if ((!bVar27) && (((data->set).prefer_ascii != false || ((data->set).crlf == true)))) {
        if ((data->state).scratch == (char *)0x0) {
          pcVar18 = (char *)(*Curl_cmalloc)(0x8000);
          (data->state).scratch = pcVar18;
          if (pcVar18 == (char *)0x0) {
            Curl_failf(data,"Failed to alloc scratch buffer!");
            return CURLE_OUT_OF_MEMORY;
          }
        }
        lVar19 = 0;
        lVar22 = 0;
        do {
          cVar5 = (data->req).upload_fromhere[lVar19];
          pcVar18 = (data->state).scratch;
          if (cVar5 == '\n') {
            lVar1 = lVar22 + 1;
            pcVar18[lVar22] = '\r';
            (data->state).scratch[lVar22 + 1] = '\n';
            lVar22 = lVar1;
            if (((data->set).crlf == false) && (lVar1 = (data->state).infilesize, lVar1 != -1)) {
              (data->state).infilesize = lVar1 + 1;
            }
          }
          else {
            pcVar18[lVar22] = cVar5;
          }
          lVar19 = lVar19 + 1;
          lVar22 = lVar22 + 1;
        } while (lVar20 != lVar19);
        if (lVar22 != lVar20) {
          (data->req).upload_fromhere = (data->state).scratch;
          (data->req).upload_present = lVar22;
          lVar20 = lVar22;
        }
      }
      if (((conn->handler->protocol & 0x30000) != 0) &&
         (CVar14 = Curl_smtp_escape_eob(conn,lVar20), CVar14 != CURLE_OK)) {
        return CVar14;
      }
      goto LAB_00126114;
    }
    uVar24 = (data->req).keepon;
  }
  else {
LAB_001268a7:
    uVar24 = (data->req).keepon;
    if ((uVar24 & 0x20) != 0) goto LAB_00126982;
  }
  (data->req).keepon = uVar24 & 0xfffffffd;
  if (((conn->bits).rewindaftersend == true) && (CVar14 = Curl_readrewind(conn), CVar14 != CURLE_OK)
     ) {
    return CVar14;
  }
LAB_00126982:
  tVar28 = curlx_tvnow();
  (data->req).now = tVar28;
  if (uVar25 == 0) {
    if (((data->req).exp100 == EXP100_AWAITING_CONTINUE) &&
       (tVar17 = curlx_tvdiff(tVar28,(data->req).start100), (data->set).expect_100_timeout <= tVar17
       )) {
      (data->req).exp100 = EXP100_SEND_DATA;
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 | 2;
      Curl_infof(data,"Done waiting for 100-continue\n");
    }
  }
  else {
    pcVar10 = (data->req).bytecountp;
    if (pcVar10 != (curl_off_t *)0x0) {
      *pcVar10 = (data->req).bytecount;
    }
    pcVar10 = (data->req).writebytecountp;
    if (pcVar10 != (curl_off_t *)0x0) {
      *pcVar10 = (data->req).writebytecount;
    }
  }
  iVar16 = Curl_pgrsUpdate(conn);
  if (iVar16 == 0) {
    CVar14 = Curl_speedcheck(data,(data->req).now);
    if (CVar14 != CURLE_OK) {
      return CVar14;
    }
    if ((data->req).keepon == 0) {
      if ((data->set).opt_no_body == false) {
        lVar20 = local_48->size;
        if (((lVar20 != -1) && (lVar22 = (data->req).bytecount, lVar20 != lVar22)) &&
           ((lVar22 != lVar20 + (data->state).crlf_conversions &&
            ((data->req).newurl == (char *)0x0)))) {
          Curl_failf(data,"transfer closed with %lld bytes remaining to read");
          return CURLE_PARTIAL_FILE;
        }
        if (((data->req).chunk == true) && ((conn->chunk).state != CHUNK_STOP)) {
          Curl_failf(data,"transfer closed with outstanding read data remaining");
          return CURLE_PARTIAL_FILE;
        }
      }
      iVar16 = Curl_pgrsUpdate(conn);
      if (iVar16 != 0) {
        return CURLE_ABORTED_BY_CALLBACK;
      }
    }
    else {
      tVar17 = Curl_timeleft(data,&(data->req).now,false);
      if (tVar17 < 0) {
        lVar20 = (data->req).size;
        tVar17 = curlx_tvdiff((data->req).now,(data->progress).t_startsingle);
        cVar11 = (data->req).bytecount;
        if (lVar20 == -1) {
          Curl_failf(data,"Operation timed out after %ld milliseconds with %lld bytes received",
                     tVar17,cVar11);
        }
        else {
          Curl_failf(data,
                     "Operation timed out after %ld milliseconds with %lld out of %lld bytes received"
                     ,tVar17,cVar11,(data->req).size);
        }
        return CURLE_OPERATION_TIMEDOUT;
      }
    }
    *done = ((data->req).keepon & 0x33) == 0;
    return CURLE_OK;
  }
  return CURLE_ABORTED_BY_CALLBACK;
}

Assistant:

CURLcode Curl_readwrite(struct connectdata *conn,
                        struct Curl_easy *data,
                        bool *done,
                        bool *comeback)
{
  struct SingleRequest *k = &data->req;
  CURLcode result;
  int didwhat=0;

  curl_socket_t fd_read;
  curl_socket_t fd_write;
  int select_res = conn->cselect_bits;

  conn->cselect_bits = 0;

  /* only use the proper socket if the *_HOLD bit is not set simultaneously as
     then we are in rate limiting state in that transfer direction */

  if((k->keepon & KEEP_RECVBITS) == KEEP_RECV)
    fd_read = conn->sockfd;
  else
    fd_read = CURL_SOCKET_BAD;

  if((k->keepon & KEEP_SENDBITS) == KEEP_SEND)
    fd_write = conn->writesockfd;
  else
    fd_write = CURL_SOCKET_BAD;

  if(conn->data->state.drain) {
    select_res |= CURL_CSELECT_IN;
    DEBUGF(infof(data, "Curl_readwrite: forcibly told to drain data\n"));
  }

  if(!select_res) /* Call for select()/poll() only, if read/write/error
                     status is not known. */
    select_res = Curl_socket_check(fd_read, CURL_SOCKET_BAD, fd_write, 0);

  if(select_res == CURL_CSELECT_ERR) {
    failf(data, "select/poll returned error");
    return CURLE_SEND_ERROR;
  }

  /* We go ahead and do a read if we have a readable socket or if
     the stream was rewound (in which case we have data in a
     buffer) */
  if((k->keepon & KEEP_RECV) &&
     ((select_res & CURL_CSELECT_IN) || conn->bits.stream_was_rewound)) {

    result = readwrite_data(data, conn, k, &didwhat, done, comeback);
    if(result || *done)
      return result;
  }

  /* If we still have writing to do, we check if we have a writable socket. */
  if((k->keepon & KEEP_SEND) && (select_res & CURL_CSELECT_OUT)) {
    /* write */

    result = readwrite_upload(data, conn, k, &didwhat);
    if(result)
      return result;
  }

  k->now = Curl_tvnow();
  if(didwhat) {
    /* Update read/write counters */
    if(k->bytecountp)
      *k->bytecountp = k->bytecount; /* read count */
    if(k->writebytecountp)
      *k->writebytecountp = k->writebytecount; /* write count */
  }
  else {
    /* no read no write, this is a timeout? */
    if(k->exp100 == EXP100_AWAITING_CONTINUE) {
      /* This should allow some time for the header to arrive, but only a
         very short time as otherwise it'll be too much wasted time too
         often. */

      /* Quoting RFC2616, section "8.2.3 Use of the 100 (Continue) Status":

         Therefore, when a client sends this header field to an origin server
         (possibly via a proxy) from which it has never seen a 100 (Continue)
         status, the client SHOULD NOT wait for an indefinite period before
         sending the request body.

      */

      time_t ms = Curl_tvdiff(k->now, k->start100);
      if(ms >= data->set.expect_100_timeout) {
        /* we've waited long enough, continue anyway */
        k->exp100 = EXP100_SEND_DATA;
        k->keepon |= KEEP_SEND;
        infof(data, "Done waiting for 100-continue\n");
      }
    }
  }

  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, k->now);
  if(result)
    return result;

  if(k->keepon) {
    if(0 > Curl_timeleft(data, &k->now, FALSE)) {
      if(k->size != -1) {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " out of %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_tvdiff(k->now, data->progress.t_startsingle), k->bytecount,
              k->size);
      }
      else {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_tvdiff(k->now, data->progress.t_startsingle), k->bytecount);
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  else {
    /*
     * The transfer has been performed. Just make some general checks before
     * returning.
     */

    if(!(data->set.opt_no_body) && (k->size != -1) &&
       (k->bytecount != k->size) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs,
          so we'll check to see if the discrepancy can be explained
          by the number of CRLFs we've changed to LFs.
       */
       (k->bytecount != (k->size + data->state.crlf_conversions)) &&
#endif /* CURL_DO_LINEEND_CONV */
       !data->req.newurl) {
      failf(data, "transfer closed with %" CURL_FORMAT_CURL_OFF_T
            " bytes remaining to read",
            k->size - k->bytecount);
      return CURLE_PARTIAL_FILE;
    }
    else if(!(data->set.opt_no_body) &&
            k->chunk &&
            (conn->chunk.state != CHUNK_STOP)) {
      /*
       * In chunked mode, return an error if the connection is closed prior to
       * the empty (terminating) chunk is read.
       *
       * The condition above used to check for
       * conn->proto.http->chunk.datasize != 0 which is true after reading
       * *any* chunk, not just the empty chunk.
       *
       */
      failf(data, "transfer closed with outstanding read data remaining");
      return CURLE_PARTIAL_FILE;
    }
    if(Curl_pgrsUpdate(conn))
      return CURLE_ABORTED_BY_CALLBACK;
  }

  /* Now update the "done" boolean we return */
  *done = (0 == (k->keepon&(KEEP_RECV|KEEP_SEND|
                            KEEP_RECV_PAUSE|KEEP_SEND_PAUSE))) ? TRUE : FALSE;

  return CURLE_OK;
}